

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.c
# Opt level: O0

void mi_options_print(void)

{
  char *pcVar1;
  long lVar2;
  _Bool _Var3;
  char *pcVar4;
  mi_option_desc_t *desc;
  long l;
  mi_option_t option;
  int i;
  int verpatch;
  int verminor;
  int vermajor;
  undefined8 uVar5;
  mi_option_t local_10;
  
  uVar5 = 0;
  _mi_message("v%i.%i.%i%s%s (built on %s, %s)\n",2,2,3,", release",", git v8.0-207-g276608d9",
              "Apr 25 2025","21:40:39");
  for (local_10 = mi_option_show_errors; (int)local_10 < 0x25;
      local_10 = local_10 + mi_option_show_stats) {
    mi_option_get((mi_option_t)((ulong)uVar5 >> 0x20));
    pcVar1 = options[local_10].name;
    lVar2 = options[local_10].value;
    _Var3 = mi_option_has_size_in_kib(local_10);
    pcVar4 = "";
    if (_Var3) {
      pcVar4 = "KiB";
    }
    _mi_message("option \'%s\': %ld %s\n",pcVar1,lVar2,pcVar4);
  }
  _mi_message("debug level : %d\n",0);
  _mi_message("secure level: %d\n",0);
  _mi_message("mem tracking: %s\n","none");
  return;
}

Assistant:

void mi_options_print(void) mi_attr_noexcept
{
  // show version
  const int vermajor = MI_MALLOC_VERSION/100;
  const int verminor = (MI_MALLOC_VERSION%100)/10;
  const int verpatch = (MI_MALLOC_VERSION%10);
  _mi_message("v%i.%i.%i%s%s (built on %s, %s)\n", vermajor, verminor, verpatch,
      #if defined(MI_CMAKE_BUILD_TYPE)
      ", " mi_stringify(MI_CMAKE_BUILD_TYPE)
      #else
      ""
      #endif
      ,
      #if defined(MI_GIT_DESCRIBE)
      ", git " mi_stringify(MI_GIT_DESCRIBE)
      #else
      ""
      #endif
      , __DATE__, __TIME__);

  // show options
  for (int i = 0; i < _mi_option_last; i++) {
    mi_option_t option = (mi_option_t)i;
    long l = mi_option_get(option); MI_UNUSED(l); // possibly initialize
    mi_option_desc_t* desc = &options[option];
    _mi_message("option '%s': %ld %s\n", desc->name, desc->value, (mi_option_has_size_in_kib(option) ? "KiB" : ""));
  }

  // show build configuration
  _mi_message("debug level : %d\n", MI_DEBUG );
  _mi_message("secure level: %d\n", MI_SECURE );
  _mi_message("mem tracking: %s\n", MI_TRACK_TOOL);
  #if MI_GUARDED
  _mi_message("guarded build: %s\n", mi_option_get(mi_option_guarded_sample_rate) != 0 ? "enabled" : "disabled");
  #endif
  #if MI_TSAN
  _mi_message("thread santizer enabled\n");
  #endif
}